

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O1

bool __thiscall Minisat::SimpSolver::merge(SimpSolver *this,Clause *_ps,Clause *_qs,Var v,int *size)

{
  bool bVar1;
  
  this->merges = this->merges + 1;
  if ((this->merge_count_cls).data != (Lit *)0x0) {
    (this->merge_count_cls).sz = 0;
  }
  bVar1 = merge(this,_ps,_qs,v,&this->merge_count_cls);
  *size = (this->merge_count_cls).sz;
  return bVar1;
}

Assistant:

bool SimpSolver::merge(const Clause &_ps, const Clause &_qs, Var v, int &size)
{
    merges++;
    merge_count_cls.clear();
    bool ret = merge(_ps, _qs, v, merge_count_cls);
    size = merge_count_cls.size();
    return ret;
}